

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroup::updateDirection(QSequentialAnimationGroup *this,Direction direction)

{
  QUntypedPropertyData *data;
  long lVar1;
  State SVar2;
  
  lVar1 = *(long *)(this + 8);
  SVar2 = QAbstractAnimation::state((QAbstractAnimation *)this);
  if (SVar2 != Stopped) {
    data = (QUntypedPropertyData *)(lVar1 + 0xb8);
    if ((*(long **)(lVar1 + 0x48) != (long *)0x0) && (**(long **)(lVar1 + 0x48) != 0)) {
      QBindingStorage::registerDependency_helper((QBindingStorage *)(lVar1 + 0x40),data);
    }
    if (*(long *)data != 0) {
      if ((*(long **)(lVar1 + 0x48) != (long *)0x0) && (**(long **)(lVar1 + 0x48) != 0)) {
        QBindingStorage::registerDependency_helper((QBindingStorage *)(lVar1 + 0x40),data);
      }
      QAbstractAnimation::setDirection(*(QAbstractAnimation **)data,direction);
      return;
    }
  }
  return;
}

Assistant:

void QSequentialAnimationGroup::updateDirection(QAbstractAnimation::Direction direction)
{
    Q_D(QSequentialAnimationGroup);
    // we need to update the direction of the current animation
    if (state() != Stopped && d->currentAnimation)
        d->currentAnimation->setDirection(direction);
}